

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void jpgd::jpeg_decoder::decode_block_ac_refine
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  short sVar1;
  uint uVar2;
  coeff_buf *pcVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  bool bVar6;
  long lVar7;
  uint8 uVar8;
  uint8 uVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  uint local_40;
  
  bVar12 = (byte)pD->m_successive_low;
  uVar14 = 1 << (bVar12 & 0x1f);
  uVar13 = -1 << (bVar12 & 0x1f);
  pcVar3 = pD->m_ac_coeffs[component_id];
  if ((pcVar3->block_num_x <= block_x) || (pcVar3->block_num_y <= block_y)) {
    __assert_fail("(block_x < cb->block_num_x) && (block_y < cb->block_num_y)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                  ,0xa21,"jpgd_block_t *jpgd::jpeg_decoder::coeff_buf_getp(coeff_buf *, int, int)");
  }
  if (0x3f < pD->m_spectral_end) {
    __assert_fail("pD->m_spectral_end <= 63",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                  ,0xa7b,
                  "static void jpgd::jpeg_decoder::decode_block_ac_refine(jpeg_decoder *, int, int, int)"
                 );
  }
  puVar4 = pcVar3->pData;
  lVar7 = (long)(pcVar3->block_num_x * block_y * pcVar3->block_size) +
          (long)(block_x * pcVar3->block_size);
  uVar15 = pD->m_spectral_start;
  if ((pD->m_eob_run == 0) && ((int)uVar15 <= pD->m_spectral_end)) {
    do {
      uVar10 = huff_decode(pD,pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]]);
      iVar17 = (int)uVar10 >> 4;
      if ((uVar10 & 0xf) == 0) {
        local_40 = 0;
        if (iVar17 != 0xf) {
          bVar12 = (byte)iVar17;
          pD->m_eob_run = 1 << (bVar12 & 0x1f);
          if (0xf < uVar10) {
            uVar10 = pD->m_bit_buf;
            iVar18 = pD->m_bits_left;
            pD->m_bits_left = iVar18 - iVar17;
            if (iVar18 - iVar17 == 0 || iVar18 < iVar17) {
              uVar11 = uVar10 << ((byte)iVar18 & 0x1f);
              pD->m_bit_buf = uVar11;
              if (pD->m_in_buf_left < 2) {
LAB_0010b77c:
                uVar8 = get_octet(pD);
                uVar9 = get_octet(pD);
                pD->m_bit_buf = pD->m_bit_buf | (uint)CONCAT11(uVar8,uVar9);
              }
              else {
                puVar5 = pD->m_pIn_buf_ofs;
                if ((*puVar5 == 0xff) || (puVar5[1] == 0xff)) goto LAB_0010b77c;
                pD->m_bit_buf = CONCAT11(*puVar5,puVar5[1]) | uVar11;
                pD->m_in_buf_left = pD->m_in_buf_left + -2;
                pD->m_pIn_buf_ofs = puVar5 + 2;
              }
              iVar17 = pD->m_bits_left;
              pD->m_bit_buf = pD->m_bit_buf << (-(char)iVar17 & 0x1fU);
              pD->m_bits_left = iVar17 + 0x10;
              if (iVar17 < -0x10) goto LAB_0010b7cf;
            }
            else {
              pD->m_bit_buf = uVar10 << (bVar12 & 0x1f);
            }
            pD->m_eob_run = pD->m_eob_run + (uVar10 >> (-bVar12 & 0x1f));
          }
          break;
        }
      }
      else {
        if ((uVar10 & 0xf) != 1) {
          stop_decoding(pD,JPGD_DECODE_ERROR);
        }
        iVar18 = pD->m_bits_left;
        uVar2 = pD->m_bit_buf;
        pD->m_bits_left = iVar18 + -1;
        if (iVar18 < 2) {
          uVar10 = uVar2 << ((byte)iVar18 & 0x1f);
          pD->m_bit_buf = uVar10;
          if (pD->m_in_buf_left < 2) {
LAB_0010b50c:
            uVar8 = get_octet(pD);
            uVar9 = get_octet(pD);
            pD->m_bit_buf = pD->m_bit_buf | (uint)CONCAT11(uVar8,uVar9);
          }
          else {
            puVar5 = pD->m_pIn_buf_ofs;
            if ((*puVar5 == 0xff) || (puVar5[1] == 0xff)) goto LAB_0010b50c;
            pD->m_bit_buf = CONCAT11(*puVar5,puVar5[1]) | uVar10;
            pD->m_in_buf_left = pD->m_in_buf_left + -2;
            pD->m_pIn_buf_ofs = puVar5 + 2;
          }
          iVar18 = pD->m_bits_left;
          pD->m_bit_buf = pD->m_bit_buf << (-(char)iVar18 & 0x1fU);
          pD->m_bits_left = iVar18 + 0x10;
          if (iVar18 < -0x10) goto LAB_0010b7cf;
        }
        else {
          pD->m_bit_buf = uVar2 * 2;
        }
        local_40 = uVar13;
        if ((int)uVar2 < 0) {
          local_40 = uVar14;
        }
      }
      do {
        lVar16 = (long)(int)(&g_ZAG)[uVar15 & 0x3f];
        if (*(short *)(puVar4 + lVar16 * 2 + lVar7) == 0) {
          iVar18 = iVar17 + -1;
          if (0 < iVar17) goto LAB_0010b68b;
          bVar6 = false;
          uVar10 = uVar15;
          iVar17 = iVar18;
        }
        else {
          iVar18 = pD->m_bits_left;
          uVar2 = pD->m_bit_buf;
          pD->m_bits_left = iVar18 + -1;
          if (iVar18 < 2) {
            uVar10 = uVar2 << ((byte)iVar18 & 0x1f);
            pD->m_bit_buf = uVar10;
            if (pD->m_in_buf_left < 2) {
LAB_0010b612:
              uVar8 = get_octet(pD);
              uVar9 = get_octet(pD);
              pD->m_bit_buf = pD->m_bit_buf | (uint)CONCAT11(uVar8,uVar9);
            }
            else {
              puVar5 = pD->m_pIn_buf_ofs;
              if ((*puVar5 == 0xff) || (puVar5[1] == 0xff)) goto LAB_0010b612;
              pD->m_bit_buf = CONCAT11(*puVar5,puVar5[1]) | uVar10;
              pD->m_in_buf_left = pD->m_in_buf_left + -2;
              pD->m_pIn_buf_ofs = puVar5 + 2;
            }
            iVar18 = pD->m_bits_left;
            pD->m_bit_buf = pD->m_bit_buf << (-(char)iVar18 & 0x1fU);
            pD->m_bits_left = iVar18 + 0x10;
            if (iVar18 < -0x10) goto LAB_0010b7cf;
          }
          else {
            pD->m_bit_buf = uVar2 * 2;
          }
          iVar18 = iVar17;
          if (((int)uVar2 < 0) &&
             (sVar1 = *(short *)(puVar4 + lVar16 * 2 + lVar7), (uVar14 & (int)sVar1) == 0)) {
            uVar10 = uVar14;
            if (sVar1 < 0) {
              uVar10 = uVar13;
            }
            *(short *)(puVar4 + lVar16 * 2 + lVar7) = (short)uVar10 + sVar1;
          }
LAB_0010b68b:
          bVar6 = true;
          uVar10 = uVar15 + 1;
          iVar17 = iVar18;
        }
      } while ((bVar6) && (uVar15 = uVar10, (int)uVar10 <= pD->m_spectral_end));
      if ((local_40 != 0) && ((int)uVar10 < 0x40)) {
        *(short *)(puVar4 + (long)(int)(&g_ZAG)[(int)uVar10] * 2 + lVar7) = (short)local_40;
      }
      uVar15 = uVar10 + 1;
    } while ((int)uVar10 < pD->m_spectral_end);
  }
  if (0 < pD->m_eob_run) {
    if ((int)uVar15 <= pD->m_spectral_end) {
      do {
        lVar16 = (long)(int)(&g_ZAG)[uVar15 & 0x3f];
        if (*(short *)(puVar4 + lVar16 * 2 + lVar7) != 0) {
          iVar17 = pD->m_bits_left;
          uVar2 = pD->m_bit_buf;
          pD->m_bits_left = iVar17 + -1;
          if (iVar17 < 2) {
            uVar10 = uVar2 << ((byte)iVar17 & 0x1f);
            pD->m_bit_buf = uVar10;
            if (pD->m_in_buf_left < 2) {
LAB_0010b390:
              uVar8 = get_octet(pD);
              uVar9 = get_octet(pD);
              pD->m_bit_buf = pD->m_bit_buf | (uint)CONCAT11(uVar8,uVar9);
            }
            else {
              puVar5 = pD->m_pIn_buf_ofs;
              if ((*puVar5 == 0xff) || (puVar5[1] == 0xff)) goto LAB_0010b390;
              pD->m_bit_buf = CONCAT11(*puVar5,puVar5[1]) | uVar10;
              pD->m_in_buf_left = pD->m_in_buf_left + -2;
              pD->m_pIn_buf_ofs = puVar5 + 2;
            }
            iVar17 = pD->m_bits_left;
            pD->m_bit_buf = pD->m_bit_buf << (-(char)iVar17 & 0x1fU);
            pD->m_bits_left = iVar17 + 0x10;
            if (iVar17 < -0x10) {
LAB_0010b7cf:
              __assert_fail("m_bits_left >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                            ,0x1e3,"uint jpgd::jpeg_decoder::get_bits_no_markers(int)");
            }
          }
          else {
            pD->m_bit_buf = uVar2 * 2;
          }
          if (((int)uVar2 < 0) &&
             (sVar1 = *(short *)(puVar4 + lVar16 * 2 + lVar7), (uVar14 & (int)sVar1) == 0)) {
            uVar10 = uVar14;
            if (sVar1 < 0) {
              uVar10 = uVar13;
            }
            *(short *)(puVar4 + lVar16 * 2 + lVar7) = (short)uVar10 + sVar1;
          }
        }
        bVar6 = (int)uVar15 < pD->m_spectral_end;
        uVar15 = uVar15 + 1;
      } while (bVar6);
    }
    pD->m_eob_run = pD->m_eob_run + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_refine(jpeg_decoder *pD, int component_id, int block_x, int block_y)
{
  int s, k, r;
  int p1 = 1 << pD->m_successive_low;
  int m1 = (-1) << pD->m_successive_low;
  jpgd_block_t *p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);
  
  JPGD_ASSERT(pD->m_spectral_end <= 63);
  
  k = pD->m_spectral_start;
  
  if (pD->m_eob_run == 0)
  {
    for ( ; k <= pD->m_spectral_end; k++)
    {
      s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]]);

      r = s >> 4;
      s &= 15;

      if (s)
      {
        if (s != 1)
          pD->stop_decoding(JPGD_DECODE_ERROR);

        if (pD->get_bits_no_markers(1))
          s = p1;
        else
          s = m1;
      }
      else
      {
        if (r != 15)
        {
          pD->m_eob_run = 1 << r;

          if (r)
            pD->m_eob_run += pD->get_bits_no_markers(r);

          break;
        }
      }

      do
      {
        jpgd_block_t *this_coef = p + g_ZAG[k & 63];

        if (*this_coef != 0)
        {
          if (pD->get_bits_no_markers(1))
          {
            if ((*this_coef & p1) == 0)
            {
              if (*this_coef >= 0)
                *this_coef = static_cast<jpgd_block_t>(*this_coef + p1);
              else
                *this_coef = static_cast<jpgd_block_t>(*this_coef + m1);
            }
          }
        }
        else
        {
          if (--r < 0)
            break;
        }

        k++;

      } while (k <= pD->m_spectral_end);

      if ((s) && (k < 64))
      {
        p[g_ZAG[k]] = static_cast<jpgd_block_t>(s);
      }
    }
  }

  if (pD->m_eob_run > 0)
  {
    for ( ; k <= pD->m_spectral_end; k++)
    {
      jpgd_block_t *this_coef = p + g_ZAG[k & 63]; // logical AND to shut up static code analysis

      if (*this_coef != 0)
      {
        if (pD->get_bits_no_markers(1))
        {
          if ((*this_coef & p1) == 0)
          {
            if (*this_coef >= 0)
              *this_coef = static_cast<jpgd_block_t>(*this_coef + p1);
            else
              *this_coef = static_cast<jpgd_block_t>(*this_coef + m1);
          }
        }
      }
    }

    pD->m_eob_run--;
  }
}